

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

CustomSection * __thiscall
Js::WebAssemblyModule::GetCustomSection
          (CustomSection *__return_storage_ptr__,WebAssemblyModule *this,uint32 index)

{
  List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  byte *pbVar1;
  charcount_t cVar2;
  undefined4 uVar3;
  uint32 uVar4;
  undefined4 uVar5;
  Type *pTVar6;
  WasmCompilationException *this_01;
  
  this_00 = (this->m_customSections).ptr;
  if ((this_00 !=
       (List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (index < (uint)(this_00->
                    super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count)) {
    pTVar6 = JsUtil::
             List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_00,index);
    cVar2 = pTVar6->nameLength;
    uVar3 = *(undefined4 *)&pTVar6->field_0xc;
    pbVar1 = pTVar6->payload;
    uVar4 = pTVar6->payloadSize;
    uVar5 = *(undefined4 *)&pTVar6->field_0x1c;
    __return_storage_ptr__->name = pTVar6->name;
    __return_storage_ptr__->nameLength = cVar2;
    *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar3;
    __return_storage_ptr__->payload = pbVar1;
    __return_storage_ptr__->payloadSize = uVar4;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar5;
    return __return_storage_ptr__;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  Wasm::WasmCompilationException::WasmCompilationException
            (this_01,L"Custom section index out of bounds %u",(ulong)index);
  __cxa_throw(this_01,&Wasm::WasmCompilationException::typeinfo,
              Wasm::WasmCompilationException::~WasmCompilationException);
}

Assistant:

Wasm::CustomSection
WebAssemblyModule::GetCustomSection(uint32 index) const
{
    if (index >= GetCustomSectionCount())
    {
        throw Wasm::WasmCompilationException(_u("Custom section index out of bounds %u"), index);
    }
    return m_customSections->Item(index);
}